

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O1

ssize_t __thiscall
duckdb_parquet::RowGroup::read(RowGroup *this,int __fd,void *__buf,size_t __nbytes)

{
  vector<duckdb_parquet::ColumnChunk,_true> *this_00;
  pointer pCVar1;
  pointer pCVar2;
  pointer pSVar3;
  pointer pSVar4;
  vector<duckdb_parquet::SortingColumn,_true> *this_01;
  int iVar5;
  int iVar6;
  int iVar7;
  reference pvVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  reference pvVar9;
  undefined4 extraout_var_01;
  undefined8 *puVar10;
  undefined4 in_register_00000034;
  TProtocol *this_02;
  pointer pCVar11;
  pointer pSVar12;
  size_type __n;
  size_type __n_00;
  uint32_t _size140;
  int16_t fid;
  TType _etype143;
  TType ftype;
  string fname;
  uint local_b0;
  ushort local_aa;
  RowGroup *local_a8;
  undefined1 local_a0 [4];
  int local_9c;
  undefined1 *local_98;
  undefined8 local_90;
  undefined1 local_88 [16];
  ulong local_78;
  ulong local_70;
  ulong local_68;
  vector<duckdb_parquet::SortingColumn,_true> *local_60;
  int64_t *local_58;
  int64_t *local_50;
  int64_t *local_48;
  int64_t *local_40;
  int16_t *local_38;
  
  this_02 = (TProtocol *)CONCAT44(in_register_00000034,__fd);
  duckdb_apache::thrift::protocol::TProtocol::incrementInputRecursionDepth(this_02);
  local_98 = local_88;
  local_90 = 0;
  local_88[0] = 0;
  iVar5 = (*this_02->_vptr_TProtocol[0x19])(this_02,&local_98);
  local_38 = &this->ordinal;
  local_40 = &this->total_compressed_size;
  local_48 = &this->file_offset;
  local_60 = &this->sorting_columns;
  local_50 = &this->num_rows;
  local_58 = &this->total_byte_size;
  this_00 = &this->columns;
  local_78 = 0;
  local_68 = 0;
  local_70 = 0;
  local_a8 = this;
  do {
    iVar6 = (*this_02->_vptr_TProtocol[0x1b])(this_02,&local_98,&local_9c,&local_aa);
    iVar6 = iVar6 + iVar5;
    if (local_9c == 0) {
      iVar5 = (*this_02->_vptr_TProtocol[0x1a])(this_02);
      if ((((local_78 & 1) != 0) && ((local_68 & 1) != 0)) && ((local_70 & 1) != 0)) {
        if (local_98 != local_88) {
          operator_delete(local_98);
        }
        this_02->input_recursion_depth_ = this_02->input_recursion_depth_ - 1;
        return (ulong)(uint)(iVar5 + iVar6);
      }
      puVar10 = (undefined8 *)__cxa_allocate_exception(0x30);
      puVar10[1] = puVar10 + 3;
      puVar10[2] = 0;
      *(undefined1 *)(puVar10 + 3) = 0;
      *puVar10 = &PTR__TException_024b6640;
      *(undefined4 *)(puVar10 + 5) = 1;
      __cxa_throw(puVar10,&duckdb_apache::thrift::protocol::TProtocolException::typeinfo,
                  duckdb_apache::thrift::TException::~TException);
    }
    switch(local_aa) {
    case 1:
      if (local_9c != 0xf) {
        iVar7 = (*this_02->_vptr_TProtocol[0x2c])(this_02);
        break;
      }
      pCVar1 = (this->columns).
               super_vector<duckdb_parquet::ColumnChunk,_std::allocator<duckdb_parquet::ColumnChunk>_>
               .
               super__Vector_base<duckdb_parquet::ColumnChunk,_std::allocator<duckdb_parquet::ColumnChunk>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pCVar2 = (this->columns).
               super_vector<duckdb_parquet::ColumnChunk,_std::allocator<duckdb_parquet::ColumnChunk>_>
               .
               super__Vector_base<duckdb_parquet::ColumnChunk,_std::allocator<duckdb_parquet::ColumnChunk>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pCVar11 = pCVar1;
      if (pCVar2 != pCVar1) {
        do {
          (*(code *)**(undefined8 **)pCVar11)(pCVar11);
          pCVar11 = pCVar11 + 1;
        } while (pCVar11 != pCVar2);
        (local_a8->columns).
        super_vector<duckdb_parquet::ColumnChunk,_std::allocator<duckdb_parquet::ColumnChunk>_>.
        super__Vector_base<duckdb_parquet::ColumnChunk,_std::allocator<duckdb_parquet::ColumnChunk>_>
        ._M_impl.super__Vector_impl_data._M_finish = pCVar1;
      }
      iVar7 = (*this_02->_vptr_TProtocol[0x1f])(this_02,local_a0,&local_b0);
      std::vector<duckdb_parquet::ColumnChunk,_std::allocator<duckdb_parquet::ColumnChunk>_>::resize
                (&this_00->
                  super_vector<duckdb_parquet::ColumnChunk,_std::allocator<duckdb_parquet::ColumnChunk>_>
                 ,(ulong)local_b0);
      this = local_a8;
      iVar7 = iVar7 + iVar6;
      if (local_b0 != 0) {
        __n = 0;
        do {
          pvVar8 = duckdb::vector<duckdb_parquet::ColumnChunk,_true>::operator[](this_00,__n);
          iVar5 = (**(code **)(*(long *)pvVar8 + 0x10))(pvVar8,this_02);
          iVar7 = iVar7 + iVar5;
          __n = __n + 1;
        } while (__n < local_b0);
      }
      iVar5 = (*this_02->_vptr_TProtocol[0x20])(this_02);
      iVar7 = iVar5 + iVar7;
      local_78 = CONCAT71((int7)(CONCAT44(extraout_var,iVar5) >> 8),1);
      goto LAB_01bb0400;
    case 2:
      if (local_9c == 10) {
        iVar5 = (*this_02->_vptr_TProtocol[0x28])(this_02,local_58);
        iVar7 = iVar5 + iVar6;
        local_68 = CONCAT71((int7)(CONCAT44(extraout_var_01,iVar5) >> 8),1);
        goto LAB_01bb0400;
      }
      iVar7 = (*this_02->_vptr_TProtocol[0x2c])(this_02);
      break;
    case 3:
      if (local_9c == 10) {
        iVar5 = (*this_02->_vptr_TProtocol[0x28])(this_02,local_50);
        iVar7 = iVar5 + iVar6;
        local_70 = CONCAT71((int7)(CONCAT44(extraout_var_00,iVar5) >> 8),1);
        goto LAB_01bb0400;
      }
      iVar7 = (*this_02->_vptr_TProtocol[0x2c])(this_02);
      break;
    case 4:
      if (local_9c == 0xf) {
        pSVar3 = (this->sorting_columns).
                 super_vector<duckdb_parquet::SortingColumn,_std::allocator<duckdb_parquet::SortingColumn>_>
                 .
                 super__Vector_base<duckdb_parquet::SortingColumn,_std::allocator<duckdb_parquet::SortingColumn>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pSVar4 = (this->sorting_columns).
                 super_vector<duckdb_parquet::SortingColumn,_std::allocator<duckdb_parquet::SortingColumn>_>
                 .
                 super__Vector_base<duckdb_parquet::SortingColumn,_std::allocator<duckdb_parquet::SortingColumn>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        pSVar12 = pSVar3;
        if (pSVar4 != pSVar3) {
          do {
            (*(code *)**(undefined8 **)pSVar12)(pSVar12);
            pSVar12 = pSVar12 + 1;
          } while (pSVar12 != pSVar4);
          (local_a8->sorting_columns).
          super_vector<duckdb_parquet::SortingColumn,_std::allocator<duckdb_parquet::SortingColumn>_>
          .
          super__Vector_base<duckdb_parquet::SortingColumn,_std::allocator<duckdb_parquet::SortingColumn>_>
          ._M_impl.super__Vector_impl_data._M_finish = pSVar3;
        }
        iVar5 = (*this_02->_vptr_TProtocol[0x1f])(this_02,local_a0,&local_b0);
        std::vector<duckdb_parquet::SortingColumn,_std::allocator<duckdb_parquet::SortingColumn>_>::
        resize(&local_60->
                super_vector<duckdb_parquet::SortingColumn,_std::allocator<duckdb_parquet::SortingColumn>_>
               ,(ulong)local_b0);
        this_01 = local_60;
        this = local_a8;
        iVar5 = iVar5 + iVar6;
        if (local_b0 != 0) {
          __n_00 = 0;
          do {
            pvVar9 = duckdb::vector<duckdb_parquet::SortingColumn,_true>::operator[](this_01,__n_00)
            ;
            iVar6 = (**(code **)(*(long *)pvVar9 + 0x10))(pvVar9,this_02);
            iVar5 = iVar5 + iVar6;
            __n_00 = __n_00 + 1;
          } while (__n_00 < local_b0);
        }
        iVar7 = (*this_02->_vptr_TProtocol[0x20])(this_02);
        iVar7 = iVar7 + iVar5;
        this->__isset = (_RowGroup__isset)((byte)this->__isset | 1);
        goto LAB_01bb0400;
      }
      iVar7 = (*this_02->_vptr_TProtocol[0x2c])(this_02);
      break;
    case 5:
      if (local_9c == 10) {
        iVar7 = (*this_02->_vptr_TProtocol[0x28])(this_02,local_48);
        iVar7 = iVar7 + iVar6;
        this->__isset = (_RowGroup__isset)((byte)this->__isset | 2);
        goto LAB_01bb0400;
      }
      iVar7 = (*this_02->_vptr_TProtocol[0x2c])(this_02);
      break;
    case 6:
      if (local_9c == 10) {
        iVar7 = (*this_02->_vptr_TProtocol[0x28])(this_02,local_40);
        iVar7 = iVar7 + iVar6;
        this->__isset = (_RowGroup__isset)((byte)this->__isset | 4);
        goto LAB_01bb0400;
      }
      iVar7 = (*this_02->_vptr_TProtocol[0x2c])(this_02);
      break;
    case 7:
      if (local_9c == 6) {
        iVar7 = (*this_02->_vptr_TProtocol[0x26])(this_02,local_38);
        iVar7 = iVar7 + iVar6;
        this->__isset = (_RowGroup__isset)((byte)this->__isset | 8);
        goto LAB_01bb0400;
      }
      iVar7 = (*this_02->_vptr_TProtocol[0x2c])(this_02);
      break;
    default:
      iVar7 = (*this_02->_vptr_TProtocol[0x2c])(this_02);
    }
    iVar7 = iVar7 + iVar6;
LAB_01bb0400:
    iVar5 = (*this_02->_vptr_TProtocol[0x1c])(this_02);
    iVar5 = iVar5 + iVar7;
  } while( true );
}

Assistant:

uint32_t RowGroup::read(::apache::thrift::protocol::TProtocol* iprot) {

  ::apache::thrift::protocol::TInputRecursionTracker tracker(*iprot);
  uint32_t xfer = 0;
  std::string fname;
  ::apache::thrift::protocol::TType ftype;
  int16_t fid;

  xfer += iprot->readStructBegin(fname);

  using ::apache::thrift::protocol::TProtocolException;

  bool isset_columns = false;
  bool isset_total_byte_size = false;
  bool isset_num_rows = false;

  while (true)
  {
    xfer += iprot->readFieldBegin(fname, ftype, fid);
    if (ftype == ::apache::thrift::protocol::T_STOP) {
      break;
    }
    switch (fid)
    {
      case 1:
        if (ftype == ::apache::thrift::protocol::T_LIST) {
          {
            this->columns.clear();
            uint32_t _size140;
            ::apache::thrift::protocol::TType _etype143;
            xfer += iprot->readListBegin(_etype143, _size140);
            this->columns.resize(_size140);
            uint32_t _i144;
            for (_i144 = 0; _i144 < _size140; ++_i144)
            {
              xfer += this->columns[_i144].read(iprot);
            }
            xfer += iprot->readListEnd();
          }
          isset_columns = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 2:
        if (ftype == ::apache::thrift::protocol::T_I64) {
          xfer += iprot->readI64(this->total_byte_size);
          isset_total_byte_size = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 3:
        if (ftype == ::apache::thrift::protocol::T_I64) {
          xfer += iprot->readI64(this->num_rows);
          isset_num_rows = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 4:
        if (ftype == ::apache::thrift::protocol::T_LIST) {
          {
            this->sorting_columns.clear();
            uint32_t _size145;
            ::apache::thrift::protocol::TType _etype148;
            xfer += iprot->readListBegin(_etype148, _size145);
            this->sorting_columns.resize(_size145);
            uint32_t _i149;
            for (_i149 = 0; _i149 < _size145; ++_i149)
            {
              xfer += this->sorting_columns[_i149].read(iprot);
            }
            xfer += iprot->readListEnd();
          }
          this->__isset.sorting_columns = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 5:
        if (ftype == ::apache::thrift::protocol::T_I64) {
          xfer += iprot->readI64(this->file_offset);
          this->__isset.file_offset = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 6:
        if (ftype == ::apache::thrift::protocol::T_I64) {
          xfer += iprot->readI64(this->total_compressed_size);
          this->__isset.total_compressed_size = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 7:
        if (ftype == ::apache::thrift::protocol::T_I16) {
          xfer += iprot->readI16(this->ordinal);
          this->__isset.ordinal = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      default:
        xfer += iprot->skip(ftype);
        break;
    }
    xfer += iprot->readFieldEnd();
  }

  xfer += iprot->readStructEnd();

  if (!isset_columns)
    throw TProtocolException(TProtocolException::INVALID_DATA);
  if (!isset_total_byte_size)
    throw TProtocolException(TProtocolException::INVALID_DATA);
  if (!isset_num_rows)
    throw TProtocolException(TProtocolException::INVALID_DATA);
  return xfer;
}